

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O1

QAction * __thiscall QUndoStack::createRedoAction(QUndoStack *this,QObject *parent,QString *prefix)

{
  long lVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  Data *pDVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  bool b;
  QAction *this_00;
  undefined4 *puVar10;
  long in_FS_OFFSET;
  QObject local_c0 [8];
  QObject local_b8 [8];
  code *local_b0;
  ImplFn local_a8;
  QObject local_a0 [8];
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  QAction::QAction(this_00,parent);
  lVar1 = *(long *)&this->field_0x8;
  if (*(long *)(lVar1 + 0xa0) == 0) {
    b = (long)*(int *)(lVar1 + 0xa8) < *(long *)(lVar1 + 0x88);
  }
  else {
    b = false;
  }
  QAction::setEnabled(this_00,b);
  local_58.d.d = (prefix->d).d;
  local_58.d.ptr = (prefix->d).ptr;
  local_58.d.size = (prefix->d).size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  if ((prefix->d).size == 0) {
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6d6304);
    pcVar4 = local_58.d.ptr;
    pDVar8 = local_58.d.d;
    qVar3 = local_98.d.size;
    pDVar7 = local_98.d.d;
    local_98.d.d = local_58.d.d;
    local_58.d.d = pDVar7;
    local_58.d.ptr = local_98.d.ptr;
    local_98.d.ptr = pcVar4;
    local_98.d.size = local_58.d.size;
    local_58.d.size = qVar3;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
    QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x6d630c);
    pcVar4 = local_78.d.ptr;
    pDVar8 = local_78.d.d;
    qVar3 = local_98.d.size;
    pDVar7 = local_98.d.d;
    pQVar2 = &(local_78.d.d)->super_QArrayData;
    qVar5 = local_78.d.size;
    pQVar6 = &(local_98.d.d)->super_QArrayData;
    local_78.d.ptr = local_98.d.ptr;
    local_98.d.d = local_78.d.d;
    local_78.d.d = pDVar7;
    local_98.d.ptr = pcVar4;
    local_98.d.size = local_78.d.size;
    local_78.d.size = qVar3;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
  }
  redoText(&local_98,this);
  QUndoStackPrivate::setPrefixedText(this_00,&local_58,&local_78,&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_b0 = QAction::setEnabled;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)canRedoChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QCallableObject<void_(QAction::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar10 + 4) = QAction::setEnabled;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_a0,(void **)this,(QObject *)&local_98,(void **)this_00,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  qVar5 = local_58.d.size;
  pcVar9 = local_58.d.ptr;
  pDVar8 = local_58.d.d;
  qVar3 = local_78.d.size;
  pcVar4 = local_78.d.ptr;
  pDVar7 = local_78.d.d;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.d = (Data *)redoTextChanged;
  local_98.d.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x48);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/util/qundostack.cpp:1088:57),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QAction **)(puVar10 + 4) = this_00;
  *(Data **)(puVar10 + 6) = pDVar8;
  *(char16_t **)(puVar10 + 8) = pcVar9;
  *(qsizetype *)(puVar10 + 10) = qVar5;
  *(Data **)(puVar10 + 0xc) = pDVar7;
  *(char16_t **)(puVar10 + 0xe) = pcVar4;
  *(qsizetype *)(puVar10 + 0x10) = qVar3;
  QObject::connectImpl
            (local_b8,(void **)this,(QObject *)&local_98,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  local_b0 = redo;
  local_a8 = (ImplFn)0x0;
  local_98.d.d = (Data *)QAction::triggered;
  local_98.d.ptr = (char16_t *)0x0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QCallableObject<void_(QUndoStack::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = redo;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)this_00,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QUndoStack::createRedoAction(QObject *parent, const QString &prefix) const
{
    QAction *action = new QAction(parent);
    action->setEnabled(canRedo());

    QString effectivePrefix = prefix;
    QString defaultText;
    if (prefix.isEmpty()) {
        effectivePrefix = tr("Redo %1");
        defaultText = tr("Redo", "Default text for redo action");
    }

    QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, redoText());

    connect(this, &QUndoStack::canRedoChanged, action, &QAction::setEnabled);
    connect(this, &QUndoStack::redoTextChanged, action, [=](const QString &text) {
        QUndoStackPrivate::setPrefixedText(action, effectivePrefix, defaultText, text);
    });
    connect(action, &QAction::triggered, this, &QUndoStack::redo);

    return action;
}